

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

JavascriptFunction * __thiscall
Js::JavascriptProxy::GetMethodHelper
          (JavascriptProxy *this,PropertyId methodId,ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  Var in_RAX;
  JavascriptFunction *pJVar3;
  Var aValue;
  PropertyRecord *pPVar4;
  Var local_28;
  Var varMethod;
  
  local_28 = in_RAX;
  bVar1 = IsRevoked(this);
  if (bVar1) {
    pPVar4 = ScriptContext::GetPropertyName(requestContext,methodId);
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,(PCWSTR)(pPVar4 + 1));
  }
  pJVar3 = (JavascriptFunction *)0x0;
  BVar2 = JavascriptOperators::GetPropertyReference
                    ((this->handler).ptr,methodId,&local_28,requestContext,(PropertyValueInfo *)0x0)
  ;
  if (BVar2 != 0) {
    BVar2 = JavascriptOperators::IsUndefinedOrNull(local_28);
    if (BVar2 == 0) {
      bVar1 = VarIs<Js::JavascriptFunction>(local_28);
      if (!bVar1) {
        pPVar4 = ScriptContext::GetPropertyName(requestContext,methodId);
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ec76,(PCWSTR)(pPVar4 + 1));
      }
      pJVar3 = VarTo<Js::JavascriptFunction>(local_28);
      aValue = CrossSite::MarshalVar
                         (requestContext,pJVar3,
                          (((((pJVar3->super_DynamicObject).super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
      ;
      pJVar3 = VarTo<Js::JavascriptFunction>(aValue);
    }
    else {
      pJVar3 = (JavascriptFunction *)0x0;
    }
  }
  return pJVar3;
}

Assistant:

JavascriptFunction* JavascriptProxy::GetMethodHelper(PropertyId methodId, ScriptContext* requestContext)
    {
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        //3. If handler is null, then throw a TypeError exception.
        if (IsRevoked())
        {
            // the proxy has been revoked; TypeError.
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, requestContext->GetPropertyName(methodId)->GetBuffer());
        }
        Var varMethod;
        //5. Let trap be the result of GetMethod(handler, "getOwnPropertyDescriptor").
        //6. ReturnIfAbrupt(trap).

        //7.3.9 GetMethod(V, P)
        //  The abstract operation GetMethod is used to get the value of a specific property of an ECMAScript language value when the value of the
        //  property is expected to be a function. The operation is called with arguments V and P where V is the ECMAScript language value, P is the
        //  property key. This abstract operation performs the following steps:
        //  1. Assert: IsPropertyKey(P) is true.
        //  2. Let func be ? GetV(V, P).
        //  3. If func is either undefined or null, return undefined.
        //  4. If IsCallable(func) is false, throw a TypeError exception.
        //  5. Return func.
        BOOL result = JavascriptOperators::GetPropertyReference(handler, methodId, &varMethod, requestContext);
        if (!result || JavascriptOperators::IsUndefinedOrNull(varMethod))
        {
            return nullptr;
        }
        if (!VarIs<JavascriptFunction>(varMethod))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_NeedFunction, requestContext->GetPropertyName(methodId)->GetBuffer());
        }

        JavascriptFunction* function = VarTo<JavascriptFunction>(varMethod);

        return VarTo<JavascriptFunction>(CrossSite::MarshalVar(requestContext,
          function, function->GetScriptContext()));
    }